

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanPhysicalDevice.cpp
# Opt level: O2

VkFormatProperties __thiscall
VulkanUtilities::VulkanPhysicalDevice::GetPhysicalDeviceFormatProperties
          (VulkanPhysicalDevice *this,VkFormat imageFormat,VkFormatProperties3 *Properties3)

{
  VkFormatProperties VVar1;
  VkFormatProperties formatProperties;
  VkFormatProperties2 VkFormatProps2;
  VkFormatProperties local_38;
  VkFormatProperties2 local_28;
  
  if (Properties3 == (VkFormatProperties3 *)0x0) {
    (*vkGetPhysicalDeviceFormatProperties)(this->m_VkDevice,imageFormat,&local_38);
  }
  else {
    *(undefined8 *)Properties3 = 0;
    Properties3->pNext = (void *)0x0;
    Properties3->linearTilingFeatures = 0;
    Properties3->optimalTilingFeatures = 0;
    Properties3->bufferFeatures = 0;
    Properties3->sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_3;
    local_28.formatProperties.linearTilingFeatures = 0;
    local_28.formatProperties.optimalTilingFeatures = 0;
    local_28.formatProperties.bufferFeatures = 0;
    local_28._28_4_ = 0;
    local_28.sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
    local_28._4_4_ = 0;
    local_28.pNext = Properties3;
    (*vkGetPhysicalDeviceFormatProperties2)(this->m_VkDevice,imageFormat,&local_28);
    local_38.bufferFeatures = local_28.formatProperties.bufferFeatures;
    local_38.linearTilingFeatures = local_28.formatProperties.linearTilingFeatures;
    local_38.optimalTilingFeatures = local_28.formatProperties.optimalTilingFeatures;
  }
  VVar1.bufferFeatures = local_38.bufferFeatures;
  VVar1.linearTilingFeatures = local_38.linearTilingFeatures;
  VVar1.optimalTilingFeatures = local_38.optimalTilingFeatures;
  return VVar1;
}

Assistant:

VkFormatProperties VulkanPhysicalDevice::GetPhysicalDeviceFormatProperties(VkFormat imageFormat, VkFormatProperties3* Properties3) const
{
    if (Properties3 != nullptr)
    {
        *Properties3       = {};
        Properties3->sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_3_KHR;

        VkFormatProperties2 VkFormatProps2{};
        VkFormatProps2.sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
        VkFormatProps2.pNext = Properties3;

        vkGetPhysicalDeviceFormatProperties2(m_VkDevice, imageFormat, &VkFormatProps2);

        return VkFormatProps2.formatProperties;
    }
    else
    {
        VkFormatProperties formatProperties;
        vkGetPhysicalDeviceFormatProperties(m_VkDevice, imageFormat, &formatProperties);
        return formatProperties;
    }
}